

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.cxx
# Opt level: O3

bool __thiscall nuraft::peer::recreate_rpc(peer *this,ptr<srv_config> *config,context *ctx)

{
  timer_helper *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Alloc_hider _Var2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  debugging_options *pdVar6;
  size_t sVar7;
  ptr<rpc_client_factory> factory;
  string local_68;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  if (((this->abandoned_)._M_base._M_i & 1U) != 0) {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) && (iVar5 = (*peVar1->_vptr_logger[7])(), 5 < iVar5)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_68,"peer %d is abandoned",
                 (ulong)(uint)((config->
                               super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->id_);
      (*peVar1->_vptr_logger[8])
                (peVar1,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                 ,"recreate_rpc",0xc3,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
    }
    return false;
  }
  local_48 = (element_type *)0x0;
  a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&ctx->ctx_lock_);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  local_48 = (ctx->rpc_cli_factory_).
             super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (a_Stack_40,
             &(ctx->rpc_cli_factory_).
              super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  pthread_mutex_unlock((pthread_mutex_t *)&ctx->ctx_lock_);
  if (local_48 == (element_type *)0x0) {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) && (iVar5 = (*peVar1->_vptr_logger[7])(), 5 < iVar5)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_(&local_68,"client factory is empty");
      (*peVar1->_vptr_logger[8])
                (peVar1,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                 ,"recreate_rpc",0xcc,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
    }
    bVar4 = false;
    goto LAB_001ae6bc;
  }
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->rpc_protector_);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  pdVar6 = debugging_options::get_instance();
  if (((pdVar6->disable_reconn_backoff_)._M_base._M_i & 1U) == 0) {
    bVar4 = timer_helper::timeout(&this->reconn_backoff_);
    if (bVar4) goto LAB_001ae527;
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) && (iVar5 = (*peVar1->_vptr_logger[7])(), 5 < iVar5)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_(&local_68,"skip reconnect this time");
      (*peVar1->_vptr_logger[8])
                (peVar1,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                 ,"recreate_rpc",0xef,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
    }
    bVar4 = false;
  }
  else {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) && (iVar5 = (*peVar1->_vptr_logger[7])(), 5 < iVar5)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_(&local_68,"reconnection back-off timer is disabled");
      (*peVar1->_vptr_logger[8])
                (peVar1,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                 ,"recreate_rpc",0xd6,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
    }
LAB_001ae527:
    this_00 = &this->reconn_backoff_;
    timer_helper::reset(this_00);
    sVar7 = timer_helper::get_duration_us(this_00);
    iVar5 = (int)(sVar7 / 1000) * 2;
    if (this->hb_interval_ <= iVar5) {
      iVar5 = this->hb_interval_;
    }
    timer_helper::set_duration_us(this_00,(long)(int)(iVar5 + (uint)(iVar5 == 0)) * 1000);
    (*local_48->_vptr_rpc_client_factory[2])
              (&local_68,local_48,
               &((config->super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                )->endpoint_);
    sVar3 = local_68._M_string_length;
    _Var2._M_p = local_68._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)0x0;
    local_68._M_string_length = 0;
    this_01 = (this->rpc_).super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->rpc_).super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var2._M_p;
    (this->rpc_).super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar3;
    if ((this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01),
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length !=
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length);
    }
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) && (iVar5 = (*peVar1->_vptr_logger[7])(), 5 < iVar5)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_68,"%p reconnect peer %d",
                 (this->rpc_).super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(ulong)(uint)((this->config_).
                                      super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->id_);
      (*peVar1->_vptr_logger[8])
                (peVar1,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                 ,"recreate_rpc",0xe3,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
    }
    timer_helper::reset(&this->last_active_timer_);
    LOCK();
    (this->busy_flag_)._M_base._M_i = false;
    UNLOCK();
    bVar4 = true;
    LOCK();
    (this->manual_free_)._M_base._M_i = true;
    UNLOCK();
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->rpc_protector_);
LAB_001ae6bc:
  if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
  }
  return bVar4;
}

Assistant:

bool peer::recreate_rpc(ptr<srv_config>& config,
                        context& ctx)
{
    if (abandoned_) {
        p_tr("peer %d is abandoned", config->get_id());
        return false;
    }

    ptr<rpc_client_factory> factory = nullptr;
    {   std::lock_guard<std::mutex> l(ctx.ctx_lock_);
        factory = ctx.rpc_cli_factory_;
    }
    if (!factory) {
        p_tr("client factory is empty");
        return false;
    }

    std::lock_guard<std::mutex> l(rpc_protector_);

    bool backoff_timer_disabled =
        debugging_options::get_instance()
        .disable_reconn_backoff_.load(std::memory_order_relaxed);
    if (backoff_timer_disabled) {
        p_tr("reconnection back-off timer is disabled");
    }

    // To avoid too frequent reconnection attempt,
    // we use exponential backoff (x2) from 1 ms to heartbeat interval.
    if (backoff_timer_disabled || reconn_backoff_.timeout()) {
        reconn_backoff_.reset();
        size_t new_duration_ms = reconn_backoff_.get_duration_us() / 1000;
        new_duration_ms = std::min( hb_interval_, (int32)new_duration_ms * 2 );
        if (!new_duration_ms) new_duration_ms = 1;
        reconn_backoff_.set_duration_ms(new_duration_ms);

        rpc_ = factory->create_client(config->get_endpoint());
        p_tr("%p reconnect peer %d", rpc_.get(), config_->get_id());

        // WARNING:
        //   A reconnection attempt should be treated as an activity,
        //   hence reset timer.
        reset_active_timer();

        set_free();
        set_manual_free();
        return true;

    } else {
        p_tr("skip reconnect this time");
    }
    return false;
}